

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O0

void al_color_xyz_to_rgb(float x,float y,float z,float *red,float *green,float *blue)

{
  float *in_RDX;
  float *in_RSI;
  float *in_RDI;
  double dVar1;
  double b;
  double g;
  double r;
  double in_stack_ffffffffffffffb8;
  
  dVar1 = srgba_linear_to_gamma(in_stack_ffffffffffffffb8);
  *in_RDI = (float)dVar1;
  dVar1 = srgba_linear_to_gamma(in_stack_ffffffffffffffb8);
  *in_RSI = (float)dVar1;
  dVar1 = srgba_linear_to_gamma(in_stack_ffffffffffffffb8);
  *in_RDX = (float)dVar1;
  return;
}

Assistant:

void al_color_xyz_to_rgb(float x, float y, float z,
    float *red, float *green, float *blue)
{
   double r = 3.2406 * x + (-1.5372 * y) + (-0.4986 * z);
   double g = -0.9689 * x + 1.8758 * y + 0.0415 * z;
   double b = 0.0557 * x + (-0.2040 * y) + 1.0570 * z;
   *red = srgba_linear_to_gamma(r);
   *green = srgba_linear_to_gamma(g);
   *blue = srgba_linear_to_gamma(b);
}